

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

TFunction * __thiscall
glslang::HlslParseContext::findPatchConstantFunction(HlslParseContext *this,TSourceLoc *loc)

{
  bool bVar1;
  size_type sVar2;
  char *pcVar3;
  reference ppTVar4;
  bool local_69;
  undefined1 local_68 [7];
  bool builtIn;
  TVector<const_glslang::TFunction_*> candidateList;
  TString mangledName;
  TSourceLoc *loc_local;
  HlslParseContext *this_local;
  
  bVar1 = TSymbolTable::isFunctionNameVariable
                    ((this->super_TParseContextBase).symbolTable,&this->patchConstantFunctionName);
  if (bVar1) {
    pcVar3 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                       (&this->patchConstantFunctionName);
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"can\'t use variable in patch constant function",pcVar3,"");
    this_local = (HlslParseContext *)0x0;
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                   &candidateList.
                    super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
                    .
                    super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   &this->patchConstantFunctionName,"(");
    TVector<const_glslang::TFunction_*>::TVector((TVector<const_glslang::TFunction_*> *)local_68);
    TSymbolTable::findFunctionNameList
              ((this->super_TParseContextBase).symbolTable,
               (TString *)
               &candidateList.
                super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
                .
                super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (TVector<const_glslang::TFunction_*> *)local_68,&local_69);
    bVar1 = std::
            vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
            ::empty((vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
                     *)local_68);
    if (bVar1) {
      pcVar3 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                         (&this->patchConstantFunctionName);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"patch constant function not found",pcVar3,"");
      this_local = (HlslParseContext *)0x0;
    }
    else {
      sVar2 = std::
              vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
              ::size((vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
                      *)local_68);
      if (sVar2 < 2) {
        ppTVar4 = std::
                  vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
                  ::operator[]((vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
                                *)local_68,0);
        this_local = (HlslParseContext *)*ppTVar4;
      }
      else {
        pcVar3 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                           (&this->patchConstantFunctionName);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"ambiguous patch constant function",pcVar3,"");
        this_local = (HlslParseContext *)0x0;
      }
    }
    TVector<const_glslang::TFunction_*>::~TVector((TVector<const_glslang::TFunction_*> *)local_68);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                  &candidateList.
                   super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
                   .
                   super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  return (TFunction *)this_local;
}

Assistant:

const TFunction* HlslParseContext::findPatchConstantFunction(const TSourceLoc& loc)
{
    if (symbolTable.isFunctionNameVariable(patchConstantFunctionName)) {
        error(loc, "can't use variable in patch constant function", patchConstantFunctionName.c_str(), "");
        return nullptr;
    }

    const TString mangledName = patchConstantFunctionName + "(";

    // create list of PCF candidates
    TVector<const TFunction*> candidateList;
    bool builtIn;
    symbolTable.findFunctionNameList(mangledName, candidateList, builtIn);

    // We have to have one and only one, or we don't know which to pick: the patchconstantfunc does not
    // allow any disambiguation of overloads.
    if (candidateList.empty()) {
        error(loc, "patch constant function not found", patchConstantFunctionName.c_str(), "");
        return nullptr;
    }

    // Based on directed experiments, it appears that if there are overloaded patchconstantfunctions,
    // HLSL picks the last one in shader source order.  Since that isn't yet implemented here, error
    // out if there is more than one candidate.
    if (candidateList.size() > 1) {
        error(loc, "ambiguous patch constant function", patchConstantFunctionName.c_str(), "");
        return nullptr;
    }

    return candidateList[0];
}